

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O1

void __thiscall NaDataStream::PutF(NaDataStream *this,char *szComment,char *szFormat,...)

{
  char in_AL;
  undefined4 *puVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argptr;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (this->szFormatBuf != (char *)0x0) {
    local_d8 = local_c8;
    local_e0 = &argptr[0].overflow_arg_area;
    local_e8 = 0x3000000018;
    vsprintf(this->szFormatBuf,szFormat,&local_e8);
    (*this->_vptr_NaDataStream[2])(this,this->szFormatBuf,szComment);
    return;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 3;
  __cxa_throw(puVar1,&NaException::typeinfo,0);
}

Assistant:

void
NaDataStream::PutF (const char* szComment, const char* szFormat, ...)
{
    if(NULL == szFormatBuf)
        throw(na_bad_value);

    va_list argptr;

    va_start(argptr, szFormat);
    vsprintf(szFormatBuf, szFormat, argptr);
    PutData(szFormatBuf, szComment);

    va_end(argptr);
}